

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

DAngle P_BulletSlope(AActor *mo,FTranslatedLineTarget *pLineTarget,int aimflags)

{
  undefined8 uVar1;
  bool bVar2;
  uint in_ECX;
  undefined4 in_register_00000014;
  FTranslatedLineTarget *vrange;
  long lVar3;
  double dVar4;
  undefined8 local_60;
  undefined1 local_58 [16];
  FTranslatedLineTarget scratch;
  
  vrange = &scratch;
  if ((FTranslatedLineTarget *)CONCAT44(in_register_00000014,aimflags) !=
      (FTranslatedLineTarget *)0x0) {
    vrange = (FTranslatedLineTarget *)CONCAT44(in_register_00000014,aimflags);
  }
  lVar3 = 0x10;
  do {
    local_58._0_8_ =
         *(double *)((long)P_BulletSlope::angdiff + lVar3) + (double)pLineTarget[6].linetarget;
    local_60 = 0;
    P_AimLineAttack((AActor *)(local_58 + 8),(DAngle *)pLineTarget,1024.0,
                    (FTranslatedLineTarget *)local_58,(DAngle *)vrange,(int)&local_60,
                    (AActor *)(ulong)in_ECX,(AActor *)0x0);
    uVar1 = local_58._8_8_;
    if (pLineTarget[0x15].angleFromSource.Degrees != 0.0) {
      bVar2 = FLevelLocals::IsFreelookAllowed(&level);
      if (bVar2) {
        dVar4 = userinfo_t::GetAimDist
                          ((userinfo_t *)((long)pLineTarget[0x15].angleFromSource.Degrees + 0x38));
        if (dVar4 <= 0.5) {
LAB_004c673b:
          (mo->super_DThinker).super_DObject._vptr_DObject = (_func_int **)uVar1;
          return (DAngle)(double)uVar1;
        }
      }
    }
    if ((lVar3 == 0) || (lVar3 = lVar3 + -8, vrange->linetarget != (AActor *)0x0))
    goto LAB_004c673b;
  } while( true );
}

Assistant:

DAngle P_BulletSlope (AActor *mo, FTranslatedLineTarget *pLineTarget, int aimflags)
{
	static const double angdiff[3] = { -5.625f, 5.625f, 0 };
	int i;
	DAngle an;
	DAngle pitch;
	FTranslatedLineTarget scratch;

	if (pLineTarget == NULL) pLineTarget = &scratch;
	// see which target is to be aimed at
	i = 2;
	do
	{
		an = mo->Angles.Yaw + angdiff[i];
		pitch = P_AimLineAttack (mo, an, 16.*64, pLineTarget, 0., aimflags);

		if (mo->player != NULL &&
			level.IsFreelookAllowed() &&
			mo->player->userinfo.GetAimDist() <= 0.5)
		{
			break;
		}
	} while (pLineTarget->linetarget == NULL && --i >= 0);

	return pitch;
}